

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer_strategy.cpp
# Opt level: O2

void __thiscall
TracerStrategy::generateActions(TracerStrategy *this,PlayerSight *sight,Actions *actions)

{
  Vec2 pos;
  Vec2 pos_00;
  undefined1 auVar1 [16];
  bool bVar2;
  int *piVar3;
  Router *this_00;
  int target_id;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar10;
  undefined1 auVar9 [16];
  
  if ((this->super_Strategy).disabled != false) {
    return;
  }
  piVar3 = *(int **)&sight->unitInSight;
  do {
    if (piVar3 == *(int **)&sight->field_0x80) {
LAB_00106384:
      target_id = sight->id;
      fVar4 = (sight->pos).x;
      fVar5 = (sight->pos).y;
LAB_0010639e:
      pos.y = fVar5;
      pos.x = fVar4;
      Actions::emplace(actions,SelectDestination,target_id,pos);
      return;
    }
    if (*piVar3 == this->target) {
      fVar4 = (float)*(undefined8 *)(piVar3 + 1);
      fVar5 = (float)((ulong)*(undefined8 *)(piVar3 + 1) >> 0x20);
      fVar6 = (float)*(undefined8 *)(piVar3 + 3) + fVar4;
      fVar7 = (float)((ulong)*(undefined8 *)(piVar3 + 3) >> 0x20) + fVar5;
      pos_00.y = fVar7;
      pos_00.x = fVar6;
      this_00 = Router::getInstance();
      bVar2 = Router::Reachable(this_00,pos_00);
      if (!bVar2) {
        fVar6 = fVar4;
        fVar7 = fVar5;
      }
      fVar4 = (sight->pos).x;
      fVar5 = (sight->pos).y;
      auVar9._0_4_ = fVar6 - fVar4;
      auVar9._4_4_ = fVar7 - fVar5;
      auVar9._8_8_ = 0;
      fVar7 = SQRT(auVar9._0_4_ * auVar9._0_4_ + auVar9._4_4_ * auVar9._4_4_);
      fVar6 = this->distance;
      if (fVar6 < fVar7) {
        auVar1._4_4_ = fVar7;
        auVar1._0_4_ = fVar7;
        auVar1._8_4_ = fVar7;
        auVar1._12_4_ = fVar7;
        auVar9 = divps(auVar9,auVar1);
        target_id = sight->id;
        fVar8 = auVar9._0_4_;
        fVar10 = auVar9._4_4_;
        if (fVar7 + -2.0 <= fVar6) {
          fVar8 = fVar8 * (fVar7 - fVar6);
          fVar10 = fVar10 * (fVar7 - fVar6);
        }
        else {
          fVar8 = fVar8 + fVar8;
          fVar10 = fVar10 + fVar10;
        }
        fVar4 = fVar4 + fVar8;
        fVar5 = fVar5 + fVar10;
        goto LAB_0010639e;
      }
      goto LAB_00106384;
    }
    piVar3 = piVar3 + 5;
  } while( true );
}

Assistant:

void TracerStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    for (auto uinfo : sight.unitInSight)
        if (uinfo.id == target)
        {
            Vec2 goal = uinfo.pos + uinfo.velocity;
            if (!Router::getInstance()->Reachable(goal))
                goal = uinfo.pos;
            Vec2 direction = goal - sight.pos;
            float dist = direction.length();
            if (dist <= distance)
                break;
            Vec2 e0 = direction / dist;
            if (dist - PlayerVelocity <= distance)
                actions->emplace(SelectDestination, sight.id, sight.pos + e0 * (dist - distance));
            else
                actions->emplace(SelectDestination, sight.id, sight.pos + e0 * PlayerVelocity);
            return;
        }
    actions->emplace(SelectDestination, sight.id, sight.pos);
    return;
}